

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[9],pstack::Dwarf::DIE::Children,char>
          (JObject *this,char (*k) [9],Children *v,char *c)

{
  ostream *os;
  Children local_40;
  Field<char[9],_pstack::Dwarf::DIE::Children> field;
  
  local_40.parent = (DIE *)k;
  field.k = (char (*) [9])v;
  os = std::operator<<(this->os,this->sep);
  field.v = &local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[9],_pstack::Dwarf::DIE::Children>,_char> *)&field.v
                    );
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }